

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread-link.cpp
# Opt level: O0

void rtosc::ring_read(ringbuffer_t *ring,char *data,size_t len,bool lookahead)

{
  __int_type _Var1;
  size_t __n;
  byte in_CL;
  size_t in_RDX;
  __atomic_base<long> *this;
  void *in_RSI;
  long *in_RDI;
  size_t r2;
  size_t r1;
  long next_read;
  long read;
  __atomic_base<long> *in_stack_ffffffffffffffc8;
  
  _Var1 = std::__atomic_base::operator_cast_to_long(in_stack_ffffffffffffffc8);
  this = (__atomic_base<long> *)((_Var1 + in_RDX) % (ulong)in_RDI[4]);
  if ((long)this < _Var1) {
    in_stack_ffffffffffffffc8 = (__atomic_base<long> *)(in_RDI[4] - _Var1);
    __n = in_RDX - (long)in_stack_ffffffffffffffc8;
    memcpy(in_RSI,(void *)(*in_RDI + _Var1),(size_t)in_stack_ffffffffffffffc8);
    memcpy((void *)((long)in_RSI + (long)in_stack_ffffffffffffffc8),(void *)*in_RDI,__n);
  }
  else {
    memcpy(in_RSI,(void *)(*in_RDI + _Var1),in_RDX);
  }
  if ((in_CL & 1) == 0) {
    std::__atomic_base<long>::operator=(this,(__int_type)in_stack_ffffffffffffffc8);
    std::__atomic_base<long>::operator=(this,(__int_type)in_stack_ffffffffffffffc8);
  }
  else {
    std::__atomic_base<long>::operator=(this,(__int_type)in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

static void ring_read(ringbuffer_t *ring, char *data, size_t len, bool lookahead)
{
    assert(ring_read_size(ring, lookahead) >= len);
    const off_t  read = lookahead ? ring->read_lookahead : ring->read;
    const off_t  next_read = (read + len)%ring->size;

    //discontinuous read
    if(next_read < read) {
        const size_t r1 = ring->size - read;
        const size_t r2 = len - r1;
        memcpy(data,    ring->buffer+read, r1);
        memcpy(data+r1, ring->buffer,      r2);
    } else { //contiguous
        memcpy(data, ring->buffer+read, len);
    }
    if (lookahead)
        ring->read_lookahead = next_read;
    else
        /* When doing an ordinary read, synchronize lookahead pointer with
         * read pointer, so that subsequent lookahead reads will start from
         * the read pointer. This way, we guarantee that the lookahead
         * queue is always equal to or shorter than the read queue.
         */
        ring->read_lookahead = ring->read = next_read;
}